

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O1

int TIFFFlushData1(TIFF *tif)

{
  int iVar1;
  uint32_t *puVar2;
  
  if ((tif->tif_rawcc < 1) || ((tif->tif_flags >> 0x14 & 1) == 0)) {
    iVar1 = 1;
  }
  else {
    if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
      TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
    }
    puVar2 = &tif->tif_curtile;
    if ((tif->tif_flags >> 10 & 1) == 0) {
      puVar2 = &tif->tif_curstrip;
    }
    iVar1 = TIFFAppendToStrip(tif,*puVar2,tif->tif_rawdata,tif->tif_rawcc);
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
  }
  return iVar1;
}

Assistant:

int TIFFFlushData1(TIFF *tif)
{
    if (tif->tif_rawcc > 0 && tif->tif_flags & TIFF_BUF4WRITE)
    {
        if (!isFillOrder(tif, tif->tif_dir.td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)tif->tif_rawdata, tif->tif_rawcc);
        if (!TIFFAppendToStrip(
                tif, isTiled(tif) ? tif->tif_curtile : tif->tif_curstrip,
                tif->tif_rawdata, tif->tif_rawcc))
        {
            /* We update those variables even in case of error since there's */
            /* code that doesn't really check the return code of this */
            /* function */
            tif->tif_rawcc = 0;
            tif->tif_rawcp = tif->tif_rawdata;
            return (0);
        }
        tif->tif_rawcc = 0;
        tif->tif_rawcp = tif->tif_rawdata;
    }
    return (1);
}